

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

char * fy_token_debug_text(fy_token *fyt)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *buf;
  size_t length;
  
  if (fyt == (fy_token *)0x0) {
    pcVar5 = "<NULL>";
  }
  else {
    uVar1 = fyt->type - FYTT_STREAM_START;
    if (0x15 < uVar1) {
      __assert_fail("typetxt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                    ,0x3e2,"char *fy_token_debug_text(struct fy_token *)");
    }
    pcVar5 = &DAT_00143fe0 + *(int *)(&DAT_00143fe0 + (ulong)uVar1 * 4);
  }
  pcVar3 = fy_token_get_text(fyt,&length);
  sVar4 = 8;
  if (length < 8) {
    sVar4 = length;
  }
  pcVar6 = "";
  if ((int)sVar4 < (int)length) {
    pcVar6 = "...";
  }
  iVar2 = asprintf(&buf,"%s:%.*s%s",pcVar5,sVar4,pcVar3,pcVar6);
  if (iVar2 != -1) {
    return buf;
  }
  __assert_fail("rc != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                ,0x3ea,"char *fy_token_debug_text(struct fy_token *)");
}

Assistant:

char *fy_token_debug_text(struct fy_token *fyt) {
    const char *typetxt;
    const char *text;
    char *buf;
    size_t length;
    int wlen;
    int rc __FY_DEBUG_UNUSED__;

    if (!fyt) {
        typetxt = "<NULL>";
        goto out;
    }

    switch (fyt->type) {
        case FYTT_NONE:
            typetxt = NULL;
            break;
        case FYTT_STREAM_START:
            typetxt = "STRM+";
            break;
        case FYTT_STREAM_END:
            typetxt = "STRM-";
            break;
        case FYTT_VERSION_DIRECTIVE:
            typetxt = "VRSD";
            break;
        case FYTT_TAG_DIRECTIVE:
            typetxt = "TAGD";
            break;
        case FYTT_DOCUMENT_START:
            typetxt = "DOC+";
            break;
        case FYTT_DOCUMENT_END:
            typetxt = "DOC-";
            break;
        case FYTT_BLOCK_SEQUENCE_START:
            typetxt = "BSEQ+";
            break;
        case FYTT_BLOCK_MAPPING_START:
            typetxt = "BMAP+";
            break;
        case FYTT_BLOCK_END:
            typetxt = "BEND";
            break;
        case FYTT_FLOW_SEQUENCE_START:
            typetxt = "FSEQ+";
            break;
        case FYTT_FLOW_SEQUENCE_END:
            typetxt = "FSEQ-";
            break;
        case FYTT_FLOW_MAPPING_START:
            typetxt = "FMAP+";
            break;
        case FYTT_FLOW_MAPPING_END:
            typetxt = "FMAP-";
            break;
        case FYTT_BLOCK_ENTRY:
            typetxt = "BENTR";
            break;
        case FYTT_FLOW_ENTRY:
            typetxt = "FENTR";
            break;
        case FYTT_KEY:
            typetxt = "KEY";
            break;
        case FYTT_SCALAR:
            typetxt = "SCLR";
            break;
        case FYTT_VALUE:
            typetxt = "VAL";
            break;
        case FYTT_ALIAS:
            typetxt = "ALIAS";
            break;
        case FYTT_ANCHOR:
            typetxt = "ANCHR";
            break;
        case FYTT_TAG:
            typetxt = "TAG";
            break;
        case FYTT_INPUT_MARKER:
            typetxt = "IMRKR";
            break;
        default:
            typetxt = NULL;
            break;
    }
    /* should never happen really */
    assert(typetxt);

    out:
    text = fy_token_get_text(fyt, &length);

    wlen = length > 8 ? 8 : length;

    rc = asprintf(&buf, "%s:%.*s%s", typetxt, wlen, text, wlen < (int) length ? "..." : "");
    assert(rc != -1);

    return buf;
}